

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::add_extensions_to_torrent
          (session_impl *this,shared_ptr<libtorrent::aux::torrent> *torrent_ptr,
          client_data_t userdata)

{
  pointer psVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer psVar4;
  shared_ptr<libtorrent::torrent_plugin> tp;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<libtorrent::torrent_plugin> local_58;
  void *local_48;
  
  local_48 = userdata.m_client_ptr;
  psVar1 = (this->m_ses_extensions)._M_elems[0].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->m_ses_extensions)._M_elems[0].
                super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    peVar2 = (psVar4->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    torrent::get_handle((torrent *)&stack0xffffffffffffffc0);
    (*peVar2->_vptr_plugin[3])
              (&local_68,peVar2,(torrent *)&stack0xffffffffffffffc0,userdata.m_type_ptr,local_48);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    _Var3._M_pi = local_60._M_pi;
    if (local_68 != (element_type *)0x0) {
      local_58.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_68;
      local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      local_68 = (element_type *)0x0;
      torrent::add_extension
                ((torrent_ptr->
                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 &local_58);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.
                  super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  }
  return;
}

Assistant:

void session_impl::add_extensions_to_torrent(
		std::shared_ptr<torrent> const& torrent_ptr, client_data_t const userdata)
	{
		for (auto& e : m_ses_extensions[plugins_all_idx])
		{
			std::shared_ptr<torrent_plugin> tp(e->new_torrent(
				torrent_ptr->get_handle(), userdata));
			if (tp) torrent_ptr->add_extension(std::move(tp));
		}
	}